

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O3

void __thiscall icu_63::RBBISetBuilder::buildRanges(RBBISetBuilder *this)

{
  UnicodeSet *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar32 where;
  UChar32 UVar4;
  int32_t iVar5;
  RangeDescriptor *pRVar6;
  void *obj;
  RBBINode *usetNode;
  int index;
  int iVar7;
  size_t in_RSI;
  UVector *this_00;
  RangeDescriptor *pRVar8;
  UnicodeString bofString;
  UnicodeString eofString;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  pRVar6 = (RangeDescriptor *)UMemory::operator_new((UMemory *)0x20,in_RSI);
  if (pRVar6 == (RangeDescriptor *)0x0) {
    this->fRangeList = (RangeDescriptor *)0x0;
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    RangeDescriptor::RangeDescriptor(pRVar6,this->fStatus);
    this->fRangeList = pRVar6;
    pRVar6->fStartChar = 0;
    pRVar6->fEndChar = 0x10ffff;
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      this_00 = this->fRB->fUSetNodes;
      iVar7 = 0;
      while (obj = UVector::elementAt(this_00,iVar7), obj != (void *)0x0) {
        pUVar1 = *(UnicodeSet **)((long)obj + 0x20);
        iVar3 = UnicodeSet::getRangeCount(pUVar1);
        if (0 < iVar3) {
          pRVar6 = this->fRangeList;
          index = 0;
          do {
            where = UnicodeSet::getRangeStart(pUVar1,index);
            UVar4 = UnicodeSet::getRangeEnd(pUVar1,index);
            for (; pRVar6->fEndChar < where; pRVar6 = pRVar6->fNext) {
            }
            if (pRVar6->fStartChar < where) {
              RangeDescriptor::split(pRVar6,where,this->fStatus);
              if (U_ZERO_ERROR < *this->fStatus) {
                return;
              }
            }
            else {
              if ((UVar4 < pRVar6->fEndChar) &&
                 (RangeDescriptor::split(pRVar6,UVar4 + 1,this->fStatus),
                 U_ZERO_ERROR < *this->fStatus)) {
                return;
              }
              iVar5 = UVector::indexOf(pRVar6->fIncludesSets,obj,0);
              if ((iVar5 == -1) &&
                 (UVector::addElement(pRVar6->fIncludesSets,obj,this->fStatus),
                 U_ZERO_ERROR < *this->fStatus)) {
                return;
              }
              index = index + (uint)(UVar4 == pRVar6->fEndChar);
              pRVar6 = pRVar6->fNext;
            }
          } while (index < iVar3);
        }
        iVar7 = iVar7 + 1;
        this_00 = this->fRB->fUSetNodes;
      }
      for (pRVar6 = this->fRangeList; pRVar6 != (RangeDescriptor *)0x0; pRVar6 = pRVar6->fNext) {
        for (pRVar8 = this->fRangeList; pRVar8 != pRVar6; pRVar8 = pRVar8->fNext) {
          UVar2 = UVector::equals(pRVar6->fIncludesSets,pRVar8->fIncludesSets);
          if (UVar2 != '\0') {
            pRVar6->fNum = pRVar8->fNum;
            break;
          }
        }
        if (pRVar6->fNum == 0) {
          iVar7 = this->fGroupCount;
          this->fGroupCount = iVar7 + 1;
          pRVar6->fNum = iVar7 + 3;
          RangeDescriptor::setDictionaryFlag(pRVar6);
          addValToSets(this,pRVar6->fIncludesSets,this->fGroupCount + 2);
        }
      }
      UnicodeString::UnicodeString(&local_70,L"eof");
      UnicodeString::UnicodeString(&local_b0,L"bof");
      iVar7 = 0;
      while (usetNode = (RBBINode *)UVector::elementAt(this->fRB->fUSetNodes,iVar7),
            usetNode != (RBBINode *)0x0) {
        pUVar1 = usetNode->fInputSet;
        UVar2 = UnicodeSet::contains(pUVar1,&local_70);
        if (UVar2 != '\0') {
          addValToSet(this,usetNode,1);
        }
        UVar2 = UnicodeSet::contains(pUVar1,&local_b0);
        if (UVar2 != '\0') {
          addValToSet(this,usetNode,2);
          this->fSawBOF = '\x01';
        }
        iVar7 = iVar7 + 1;
      }
      UnicodeString::~UnicodeString(&local_b0);
      UnicodeString::~UnicodeString(&local_70);
    }
  }
  return;
}

Assistant:

void RBBISetBuilder::buildRanges() {
    RBBINode        *usetNode;
    RangeDescriptor *rlRange;

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "usets")) {printSets();}

    //
    //  Initialize the process by creating a single range encompassing all characters
    //  that is in no sets.
    //
    fRangeList                = new RangeDescriptor(*fStatus); // will check for status here
    if (fRangeList == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fRangeList->fStartChar    = 0;
    fRangeList->fEndChar      = 0x10ffff;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //
    //  Find the set of non-overlapping ranges of characters
    //
    int  ni;
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }

        UnicodeSet      *inputSet             = usetNode->fInputSet;
        int32_t          inputSetRangeCount   = inputSet->getRangeCount();
        int              inputSetRangeIndex   = 0;
                         rlRange              = fRangeList;

        for (;;) {
            if (inputSetRangeIndex >= inputSetRangeCount) {
                break;
            }
            UChar32      inputSetRangeBegin  = inputSet->getRangeStart(inputSetRangeIndex);
            UChar32      inputSetRangeEnd    = inputSet->getRangeEnd(inputSetRangeIndex);

            // skip over ranges from the range list that are completely
            //   below the current range from the input unicode set.
            while (rlRange->fEndChar < inputSetRangeBegin) {
                rlRange = rlRange->fNext;
            }

            // If the start of the range from the range list is before with
            //   the start of the range from the unicode set, split the range list range
            //   in two, with one part being before (wholly outside of) the unicode set
            //   and the other containing the rest.
            //   Then continue the loop; the post-split current range will then be skipped
            //     over
            if (rlRange->fStartChar < inputSetRangeBegin) {
                rlRange->split(inputSetRangeBegin, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
                continue;
            }

            // Same thing at the end of the ranges...
            // If the end of the range from the range list doesn't coincide with
            //   the end of the range from the unicode set, split the range list
            //   range in two.  The first part of the split range will be
            //   wholly inside the Unicode set.
            if (rlRange->fEndChar > inputSetRangeEnd) {
                rlRange->split(inputSetRangeEnd+1, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // The current rlRange is now entirely within the UnicodeSet range.
            // Add this unicode set to the list of sets for this rlRange
            if (rlRange->fIncludesSets->indexOf(usetNode) == -1) {
                rlRange->fIncludesSets->addElement(usetNode, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // Advance over ranges that we are finished with.
            if (inputSetRangeEnd == rlRange->fEndChar) {
                inputSetRangeIndex++;
            }
            rlRange = rlRange->fNext;
        }
    }

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "range")) { printRanges();}

    //
    //  Group the above ranges, with each group consisting of one or more
    //    ranges that are in exactly the same set of original UnicodeSets.
    //    The groups are numbered, and these group numbers are the set of
    //    input symbols recognized by the run-time state machine.
    //
    //    Numbering: # 0  (state table column 0) is unused.
    //               # 1  is reserved - table column 1 is for end-of-input
    //               # 2  is reserved - table column 2 is for beginning-in-input
    //               # 3  is the first range list.
    //
    RangeDescriptor *rlSearchRange;
    for (rlRange = fRangeList; rlRange!=0; rlRange=rlRange->fNext) {
        for (rlSearchRange=fRangeList; rlSearchRange != rlRange; rlSearchRange=rlSearchRange->fNext) {
            if (rlRange->fIncludesSets->equals(*rlSearchRange->fIncludesSets)) {
                rlRange->fNum = rlSearchRange->fNum;
                break;
            }
        }
        if (rlRange->fNum == 0) {
            fGroupCount ++;
            rlRange->fNum = fGroupCount+2; 
            rlRange->setDictionaryFlag();
            addValToSets(rlRange->fIncludesSets, fGroupCount+2);
        }
    }

    // Handle input sets that contain the special string {eof}.
    //   Column 1 of the state table is reserved for EOF on input.
    //   Column 2 is reserved for before-the-start-input.
    //            (This column can be optimized away later if there are no rule
    //             references to {bof}.)
    //   Add this column value (1 or 2) to the equivalent expression
    //     subtree for each UnicodeSet that contains the string {eof}
    //   Because {bof} and {eof} are not a characters in the normal sense,
    //   they doesn't affect the computation of ranges or TRIE.
    static const UChar eofUString[] = {0x65, 0x6f, 0x66, 0};
    static const UChar bofUString[] = {0x62, 0x6f, 0x66, 0};

    UnicodeString eofString(eofUString);
    UnicodeString bofString(bofUString);
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }
        UnicodeSet      *inputSet = usetNode->fInputSet;
        if (inputSet->contains(eofString)) {
            addValToSet(usetNode, 1);
        }
        if (inputSet->contains(bofString)) {
            addValToSet(usetNode, 2);
            fSawBOF = TRUE;
        }
    }


    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "rgroup")) {printRangeGroups();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "esets")) {printSets();}
}